

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ulong uVar1;
  ZSTD_compressionParameters cPar_00;
  ZSTD_strategy ZVar2;
  ZSTD_strategy ZVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  ZVar3 = ZSTD_btultra2;
  if (cPar.strategy < ZSTD_btultra2) {
    ZVar3 = cPar.strategy;
  }
  ZVar2 = ZSTD_fast;
  if (0 < (int)cPar.strategy) {
    ZVar2 = ZVar3;
  }
  auVar6._0_4_ = -(uint)((int)cPar.windowLog < (int)DAT_006d0790);
  auVar6._4_4_ = -(uint)((int)cPar.chainLog < DAT_006d0790._4_4_);
  auVar6._8_4_ = -(uint)((int)cPar.hashLog < DAT_006d0790._8_4_);
  auVar6._12_4_ = -(uint)((int)cPar.searchLog < DAT_006d0790._12_4_);
  auVar7 = cPar._0_16_ ^ _DAT_006a33e0;
  auVar8._0_4_ = -(uint)(-0x7fffffe2 < auVar7._0_4_);
  auVar8._4_4_ = -(uint)(-0x7fffffe3 < auVar7._4_4_);
  auVar8._8_4_ = -(uint)(-0x7fffffe3 < auVar7._8_4_);
  auVar8._12_4_ = -(uint)(-0x7fffffe3 < auVar7._12_4_);
  auVar6 = auVar6 & _DAT_006d0790 | ~auVar6 & (auVar8 & _DAT_006d07b0 | ~auVar8 & cPar._0_16_);
  uVar1 = cPar._16_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  uVar5 = -(uint)((int)cPar.minMatch < 3);
  uVar4 = CONCAT44(-(uint)(-0x7ffe0001 < SUB164(_DAT_006a33e0 ^ auVar7,4)),
                   -(uint)(-0x7ffffffa < SUB164(_DAT_006a33e0 ^ auVar7,0)));
  uVar1 = ~CONCAT44(-(uint)((long)uVar1 < 0),uVar5) & (uVar4 & (ulong)DAT_006d07e0 | ~uVar4 & uVar1)
  ;
  cPar.minMatch = uVar5 & 3 | (uint)uVar1;
  cPar.targetLength = (uint)(uVar1 >> 0x20);
  cPar_00.strategy = ZVar2;
  cPar_00.targetLength = cPar.targetLength;
  cPar_00.minMatch = cPar.minMatch;
  cPar_00.windowLog = auVar6._0_4_;
  cPar_00.chainLog = auVar6._4_4_;
  cPar_00.hashLog = auVar6._8_4_;
  cPar_00.searchLog = auVar6._12_4_;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar_00,srcSize | -(ulong)(srcSize == 0),dictSize,
             ZSTD_cpm_unknown);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters
ZSTD_adjustCParams(ZSTD_compressionParameters cPar,
                   unsigned long long srcSize,
                   size_t dictSize)
{
    cPar = ZSTD_clampCParams(cPar);   /* resulting cPar is necessarily valid (all parameters within range) */
    if (srcSize == 0) srcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    return ZSTD_adjustCParams_internal(cPar, srcSize, dictSize, ZSTD_cpm_unknown);
}